

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::Selectable(char *label,bool selected,ImGuiSelectableFlags flags,ImVec2 *size_arg)

{
  ImVec2 IVar1;
  ImVec2 p_min;
  undefined1 uVar2;
  bool bVar3;
  float *in_RCX;
  uint in_EDX;
  byte in_SIL;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  ImRect IVar7;
  ImU32 col;
  bool pressed;
  bool held;
  bool hovered;
  bool was_selected;
  ImGuiButtonFlags button_flags;
  bool disabled_global;
  bool item_add;
  bool disabled_item;
  float backup_clip_rect_max_x;
  float backup_clip_rect_min_x;
  float spacing_U;
  float spacing_L;
  float spacing_y;
  float spacing_x;
  ImRect bb;
  ImVec2 text_max;
  ImVec2 text_min;
  float max_x;
  float min_x;
  bool span_all_columns;
  ImVec2 pos;
  ImVec2 size;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImRect *in_stack_fffffffffffffef8;
  float in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  float in_stack_ffffffffffffff08;
  float in_stack_ffffffffffffff0c;
  ImGuiID id_00;
  float in_stack_ffffffffffffff10;
  ImGuiID in_stack_ffffffffffffff14;
  float in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  float fVar8;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  float fVar9;
  undefined4 in_stack_ffffffffffffff28;
  float _x;
  undefined4 in_stack_ffffffffffffff2c;
  float fVar10;
  ImVec2 *text_size_if_known;
  char *in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  ImU32 in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  ImVec2 *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff5c;
  uint uVar11;
  undefined3 uVar12;
  byte bVar13;
  uint uVar14;
  undefined1 in_stack_ffffffffffffff64;
  float fVar15;
  float fVar16;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  float in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  float local_78;
  float fStack_74;
  ImVec2 local_70;
  float fVar17;
  float fVar18;
  undefined8 local_54;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImGuiID local_3c;
  ImGuiStyle *local_38;
  ImGuiContext *local_30;
  ImGuiWindow *local_28;
  float *local_20;
  uint local_18;
  byte local_11;
  bool local_1;
  
  local_11 = in_SIL & 1;
  local_20 = in_RCX;
  local_18 = in_EDX;
  local_28 = GetCurrentWindow();
  if ((local_28->SkipItems & 1U) == 0) {
    local_30 = GImGui;
    local_38 = &GImGui->Style;
    text_size_if_known = (ImVec2 *)0x0;
    local_3c = ImGuiWindow::GetID((ImGuiWindow *)
                                  CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                  (char *)CONCAT44(in_stack_ffffffffffffff1c,
                                                   in_stack_ffffffffffffff18),
                                  (char *)CONCAT44(in_stack_ffffffffffffff14,
                                                   in_stack_ffffffffffffff10));
    local_44 = CalcTextSize((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                            (char *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                            SUB41((uint)in_stack_ffffffffffffff1c >> 0x18,0),
                            in_stack_ffffffffffffff18);
    if ((*local_20 != 0.0) || (NAN(*local_20))) {
      _x = *local_20;
    }
    else {
      _x = local_44.x;
    }
    if ((local_20[1] != 0.0) || (NAN(local_20[1]))) {
      fVar9 = local_20[1];
    }
    else {
      fVar9 = local_44.y;
    }
    fVar10 = _x;
    ImVec2::ImVec2(&local_4c,_x,fVar9);
    IVar1 = (local_28->DC).CursorPos;
    local_54._4_4_ = IVar1.y;
    local_54._4_4_ = (local_28->DC).CurrLineTextBaseOffset + local_54._4_4_;
    local_54._0_4_ = IVar1.x;
    ItemSize((ImVec2 *)CONCAT44(fVar9,in_stack_ffffffffffffff20),in_stack_ffffffffffffff1c);
    bVar4 = (local_18 & 2) != 0;
    if (bVar4) {
      fVar8 = (local_28->ParentWorkRect).Max.x;
      fVar18 = (local_28->ParentWorkRect).Min.x;
    }
    else {
      fVar8 = (local_28->WorkRect).Max.x;
      fVar18 = (float)local_54;
    }
    fVar17 = fVar8;
    if (((*local_20 == 0.0) && (!NAN(*local_20))) || ((local_18 & 0x1000000) != 0)) {
      local_4c.x = ImMax<float>(local_44.x,fVar8 - fVar18);
    }
    ImVec2::ImVec2(&local_70,fVar18 + local_4c.x,local_54._4_4_ + local_4c.y);
    ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                   in_stack_ffffffffffffff00);
    if ((local_18 & 0x8000000) == 0) {
      if (bVar4) {
        in_stack_ffffffffffffff18 = 0.0;
      }
      else {
        in_stack_ffffffffffffff18 = (local_38->ItemSpacing).x;
      }
      fVar16 = (local_38->ItemSpacing).y;
      in_stack_ffffffffffffff74 = (float)(int)(in_stack_ffffffffffffff18 * 0.5);
      in_stack_ffffffffffffff70 = (float)(int)(fVar16 * 0.5);
      in_stack_ffffffffffffff80 = in_stack_ffffffffffffff80 - in_stack_ffffffffffffff74;
      in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 - in_stack_ffffffffffffff70;
      local_78 = (in_stack_ffffffffffffff18 - in_stack_ffffffffffffff74) + local_78;
      fStack_74 = (fVar16 - in_stack_ffffffffffffff70) + fStack_74;
      in_stack_ffffffffffffff7c = in_stack_ffffffffffffff18;
    }
    fVar16 = (local_28->ClipRect).Min.x;
    fVar15 = (local_28->ClipRect).Max.x;
    if (bVar4) {
      (local_28->ClipRect).Min.x = (local_28->ParentWorkRect).Min.x;
      (local_28->ClipRect).Max.x = (local_28->ParentWorkRect).Max.x;
    }
    bVar5 = (local_18 & 8) != 0;
    uVar2 = ItemAdd((ImRect *)CONCAT44(fVar10,_x),(ImGuiID)fVar9,
                    (ImRect *)CONCAT44(fVar8,in_stack_ffffffffffffff18),in_stack_ffffffffffffff14);
    if (bVar4) {
      (local_28->ClipRect).Min.x = fVar16;
      (local_28->ClipRect).Max.x = fVar15;
    }
    if ((bool)uVar2) {
      bVar6 = (local_30->CurrentItemFlags & 4U) != 0;
      if (((bVar5 & 1) != 0) && (!(bool)bVar6)) {
        BeginDisabled(SUB41((uint)in_stack_ffffffffffffff04 >> 0x18,0));
      }
      if ((bVar4) && ((local_28->DC).CurrentColumns != (ImGuiOldColumns *)0x0)) {
        PushColumnsBackground();
      }
      else if ((bVar4) && (local_30->CurrentTable != (ImGuiTable *)0x0)) {
        TablePushBackgroundChannel();
      }
      uVar14 = 0;
      if ((local_18 & 0x100000) != 0) {
        uVar14 = 0x20000;
      }
      if ((local_18 & 0x10000000) != 0) {
        uVar14 = uVar14 | 0x100000;
      }
      if ((local_18 & 0x400000) != 0) {
        uVar14 = uVar14 | 0x10;
      }
      if ((local_18 & 0x800000) != 0) {
        uVar14 = uVar14 | 0x80;
      }
      if ((local_18 & 4) != 0) {
        uVar14 = uVar14 | 0x120;
      }
      if ((local_18 & 0x10) != 0) {
        uVar14 = uVar14 | 0x1000;
      }
      uVar11 = CONCAT13(local_11,(int3)in_stack_ffffffffffffff5c) & 0x1ffffff;
      bVar3 = ButtonBehavior((ImRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                             ,(ImGuiID)in_stack_ffffffffffffff7c,
                             (bool *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                             (bool *)CONCAT44(fVar16,fVar15),
                             CONCAT13(bVar5,CONCAT12(uVar2,CONCAT11(bVar6,in_stack_ffffffffffffff64)
                                                    )));
      uVar12 = (undefined3)(uVar11 >> 8);
      fVar9 = (float)CONCAT31(uVar12,bVar3);
      if (((((local_18 & 0x200000) != 0) && (local_30->NavJustMovedToId != 0)) &&
          (local_30->NavJustMovedToFocusScopeId == local_30->CurrentFocusScopeId)) &&
         (local_30->NavJustMovedToId == local_3c)) {
        fVar9 = (float)CONCAT31(uVar12,1);
        local_11 = 1;
      }
      if ((((SUB41(fVar9,0) != '\0') ||
           ((((uint)fVar9 & 0x10000) != 0 && ((local_18 & 0x4000000) != 0)))) &&
          ((local_30->NavDisableMouseHover & 1U) == 0)) &&
         ((local_30->NavWindow == local_28 && (local_30->NavLayer == (local_28->DC).NavLayerCurrent)
          ))) {
        in_stack_ffffffffffffff10 = (float)(local_28->DC).NavLayerCurrent;
        in_stack_ffffffffffffff14 = local_30->CurrentFocusScopeId;
        id_00 = local_3c;
        IVar7 = WindowRectAbsToRel((ImGuiWindow *)
                                   CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                                   in_stack_fffffffffffffef8);
        in_stack_ffffffffffffff4c = IVar7.Min.x;
        in_stack_ffffffffffffff50 = IVar7._4_8_;
        SetNavID(id_00,(ImGuiNavLayer)in_stack_ffffffffffffff10,in_stack_ffffffffffffff14,
                 (ImRect *)&stack0xffffffffffffff4c);
        local_30->NavDisableHighlight = true;
      }
      if (((uint)fVar9 & 1) != 0) {
        MarkItemEdited(local_3c);
      }
      if ((local_18 & 0x10) != 0) {
        SetItemAllowOverlap();
      }
      bVar13 = (byte)((uint)fVar9 >> 0x18);
      if ((local_11 & 1) != (bVar13 & 1)) {
        (local_30->LastItemData).StatusFlags = (local_30->LastItemData).StatusFlags | 8;
      }
      if ((((uint)fVar9 & 0x100) != 0) && ((local_18 & 0x2000000) != 0)) {
        fVar9 = (float)CONCAT13(bVar13,CONCAT12(1,SUB42(fVar9,0)));
      }
      if ((((uint)fVar9 & 0x10000) != 0) || ((local_11 & 1) != 0)) {
        in_stack_ffffffffffffff48 = GetColorU32(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
        ;
        in_stack_ffffffffffffff40 =
             (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
        in_stack_ffffffffffffff38 = (char *)CONCAT44(fStack_74,local_78);
        p_min.y = in_stack_ffffffffffffff74;
        p_min.x = in_stack_ffffffffffffff70;
        IVar1.y = fVar16;
        IVar1.x = fVar15;
        RenderFrame(p_min,IVar1,
                    CONCAT13(bVar5,CONCAT12(uVar2,CONCAT11(bVar6,in_stack_ffffffffffffff64))),
                    SUB41(uVar14 >> 0x18,0),fVar9);
      }
      RenderNavHighlight((ImRect *)CONCAT44(fVar18,fVar17),(ImGuiID)((ulong)local_54 >> 0x20),
                         (ImGuiNavHighlightFlags)local_54);
      if ((bVar4) && ((local_28->DC).CurrentColumns != (ImGuiOldColumns *)0x0)) {
        PopColumnsBackground();
      }
      else if ((bVar4) && (local_30->CurrentTable != (ImGuiTable *)0x0)) {
        TablePopBackgroundChannel();
      }
      RenderTextClipped(in_stack_ffffffffffffff50,
                        (ImVec2 *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                        in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,text_size_if_known,
                        (ImVec2 *)CONCAT44(fVar10,_x),
                        (ImRect *)
                        CONCAT17(bVar5,CONCAT16(uVar2,CONCAT15(bVar6,CONCAT14(
                                                  in_stack_ffffffffffffff64,uVar14)))));
      bVar13 = SUB41(fVar9,0);
      if ((((((uint)fVar9 & 1) != 0) && ((local_28->Flags & 0x4000000U) != 0)) &&
          ((local_18 & 1) == 0)) && (((local_30->LastItemData).InFlags & 0x20U) == 0)) {
        CloseCurrentPopup();
      }
      if (((bVar5 & 1) != 0) && ((bVar6 & 1) == 0)) {
        EndDisabled();
      }
      local_1 = (bool)(bVar13 & 1);
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::Selectable(const char* label, bool selected, ImGuiSelectableFlags flags, const ImVec2& size_arg)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    // Submit label or explicit size to ItemSize(), whereas ItemAdd() will submit a larger/spanning rectangle.
    ImGuiID id = window->GetID(label);
    ImVec2 label_size = CalcTextSize(label, NULL, true);
    ImVec2 size(size_arg.x != 0.0f ? size_arg.x : label_size.x, size_arg.y != 0.0f ? size_arg.y : label_size.y);
    ImVec2 pos = window->DC.CursorPos;
    pos.y += window->DC.CurrLineTextBaseOffset;
    ItemSize(size, 0.0f);

    // Fill horizontal space
    // We don't support (size < 0.0f) in Selectable() because the ItemSpacing extension would make explicitly right-aligned sizes not visibly match other widgets.
    const bool span_all_columns = (flags & ImGuiSelectableFlags_SpanAllColumns) != 0;
    const float min_x = span_all_columns ? window->ParentWorkRect.Min.x : pos.x;
    const float max_x = span_all_columns ? window->ParentWorkRect.Max.x : window->WorkRect.Max.x;
    if (size_arg.x == 0.0f || (flags & ImGuiSelectableFlags_SpanAvailWidth))
        size.x = ImMax(label_size.x, max_x - min_x);

    // Text stays at the submission position, but bounding box may be extended on both sides
    const ImVec2 text_min = pos;
    const ImVec2 text_max(min_x + size.x, pos.y + size.y);

    // Selectables are meant to be tightly packed together with no click-gap, so we extend their box to cover spacing between selectable.
    ImRect bb(min_x, pos.y, text_max.x, text_max.y);
    if ((flags & ImGuiSelectableFlags_NoPadWithHalfSpacing) == 0)
    {
        const float spacing_x = span_all_columns ? 0.0f : style.ItemSpacing.x;
        const float spacing_y = style.ItemSpacing.y;
        const float spacing_L = IM_FLOOR(spacing_x * 0.50f);
        const float spacing_U = IM_FLOOR(spacing_y * 0.50f);
        bb.Min.x -= spacing_L;
        bb.Min.y -= spacing_U;
        bb.Max.x += (spacing_x - spacing_L);
        bb.Max.y += (spacing_y - spacing_U);
    }
    //if (g.IO.KeyCtrl) { GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(0, 255, 0, 255)); }

    // Modify ClipRect for the ItemAdd(), faster than doing a PushColumnsBackground/PushTableBackground for every Selectable..
    const float backup_clip_rect_min_x = window->ClipRect.Min.x;
    const float backup_clip_rect_max_x = window->ClipRect.Max.x;
    if (span_all_columns)
    {
        window->ClipRect.Min.x = window->ParentWorkRect.Min.x;
        window->ClipRect.Max.x = window->ParentWorkRect.Max.x;
    }

    const bool disabled_item = (flags & ImGuiSelectableFlags_Disabled) != 0;
    const bool item_add = ItemAdd(bb, id, NULL, disabled_item ? ImGuiItemFlags_Disabled : ImGuiItemFlags_None);
    if (span_all_columns)
    {
        window->ClipRect.Min.x = backup_clip_rect_min_x;
        window->ClipRect.Max.x = backup_clip_rect_max_x;
    }

    if (!item_add)
        return false;

    const bool disabled_global = (g.CurrentItemFlags & ImGuiItemFlags_Disabled) != 0;
    if (disabled_item && !disabled_global) // Only testing this as an optimization
        BeginDisabled();

    // FIXME: We can standardize the behavior of those two, we could also keep the fast path of override ClipRect + full push on render only,
    // which would be advantageous since most selectable are not selected.
    if (span_all_columns && window->DC.CurrentColumns)
        PushColumnsBackground();
    else if (span_all_columns && g.CurrentTable)
        TablePushBackgroundChannel();

    // We use NoHoldingActiveID on menus so user can click and _hold_ on a menu then drag to browse child entries
    ImGuiButtonFlags button_flags = 0;
    if (flags & ImGuiSelectableFlags_NoHoldingActiveID) { button_flags |= ImGuiButtonFlags_NoHoldingActiveId; }
    if (flags & ImGuiSelectableFlags_NoSetKeyOwner)     { button_flags |= ImGuiButtonFlags_NoSetKeyOwner; }
    if (flags & ImGuiSelectableFlags_SelectOnClick)     { button_flags |= ImGuiButtonFlags_PressedOnClick; }
    if (flags & ImGuiSelectableFlags_SelectOnRelease)   { button_flags |= ImGuiButtonFlags_PressedOnRelease; }
    if (flags & ImGuiSelectableFlags_AllowDoubleClick)  { button_flags |= ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnDoubleClick; }
    if (flags & ImGuiSelectableFlags_AllowItemOverlap)  { button_flags |= ImGuiButtonFlags_AllowItemOverlap; }

    const bool was_selected = selected;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);

    // Auto-select when moved into
    // - This will be more fully fleshed in the range-select branch
    // - This is not exposed as it won't nicely work with some user side handling of shift/control
    // - We cannot do 'if (g.NavJustMovedToId != id) { selected = false; pressed = was_selected; }' for two reasons
    //   - (1) it would require focus scope to be set, need exposing PushFocusScope() or equivalent (e.g. BeginSelection() calling PushFocusScope())
    //   - (2) usage will fail with clipped items
    //   The multi-select API aim to fix those issues, e.g. may be replaced with a BeginSelection() API.
    if ((flags & ImGuiSelectableFlags_SelectOnNav) && g.NavJustMovedToId != 0 && g.NavJustMovedToFocusScopeId == g.CurrentFocusScopeId)
        if (g.NavJustMovedToId == id)
            selected = pressed = true;

    // Update NavId when clicking or when Hovering (this doesn't happen on most widgets), so navigation can be resumed with gamepad/keyboard
    if (pressed || (hovered && (flags & ImGuiSelectableFlags_SetNavIdOnHover)))
    {
        if (!g.NavDisableMouseHover && g.NavWindow == window && g.NavLayer == window->DC.NavLayerCurrent)
        {
            SetNavID(id, window->DC.NavLayerCurrent, g.CurrentFocusScopeId, WindowRectAbsToRel(window, bb)); // (bb == NavRect)
            g.NavDisableHighlight = true;
        }
    }
    if (pressed)
        MarkItemEdited(id);

    if (flags & ImGuiSelectableFlags_AllowItemOverlap)
        SetItemAllowOverlap();

    // In this branch, Selectable() cannot toggle the selection so this will never trigger.
    if (selected != was_selected) //-V547
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_ToggledSelection;

    // Render
    if (held && (flags & ImGuiSelectableFlags_DrawHoveredWhenHeld))
        hovered = true;
    if (hovered || selected)
    {
        const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
        RenderFrame(bb.Min, bb.Max, col, false, 0.0f);
    }
    RenderNavHighlight(bb, id, ImGuiNavHighlightFlags_TypeThin | ImGuiNavHighlightFlags_NoRounding);

    if (span_all_columns && window->DC.CurrentColumns)
        PopColumnsBackground();
    else if (span_all_columns && g.CurrentTable)
        TablePopBackgroundChannel();

    RenderTextClipped(text_min, text_max, label, NULL, &label_size, style.SelectableTextAlign, &bb);

    // Automatically close popups
    if (pressed && (window->Flags & ImGuiWindowFlags_Popup) && !(flags & ImGuiSelectableFlags_DontClosePopups) && !(g.LastItemData.InFlags & ImGuiItemFlags_SelectableDontClosePopup))
        CloseCurrentPopup();

    if (disabled_item && !disabled_global)
        EndDisabled();

    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, g.LastItemData.StatusFlags);
    return pressed; //-V1020
}